

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O1

bool __thiscall
ObjectFile::setAttribute(ObjectFile *this,CK_ATTRIBUTE_TYPE type,OSAttribute *attribute)

{
  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  *this_00;
  mapped_type *ppOVar1;
  OSAttribute *this_01;
  undefined1 uVar2;
  MutexLocker lock;
  CK_ATTRIBUTE_TYPE local_38;
  MutexLocker local_30;
  
  local_38 = type;
  if (this->valid == false) {
    uVar2 = 0;
    softHSMLog(7,"setAttribute",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,0xd5,"Cannot update invalid object %s",(this->path)._M_dataplus._M_p);
  }
  else {
    MutexLocker::MutexLocker(&local_30,this->objectMutex);
    this_00 = &this->attributes;
    ppOVar1 = std::
              map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
              ::operator[](this_00,&local_38);
    if (*ppOVar1 != (mapped_type)0x0) {
      ppOVar1 = std::
                map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                ::operator[](this_00,&local_38);
      if (*ppOVar1 != (mapped_type)0x0) {
        (*(*ppOVar1)->_vptr_OSAttribute[1])();
      }
      ppOVar1 = std::
                map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                ::operator[](this_00,&local_38);
      *ppOVar1 = (mapped_type)0x0;
    }
    this_01 = (OSAttribute *)operator_new(0xa0);
    OSAttribute::OSAttribute(this_01,attribute);
    ppOVar1 = std::
              map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
              ::operator[](this_00,&local_38);
    *ppOVar1 = this_01;
    MutexLocker::~MutexLocker(&local_30);
    store(this,false);
    uVar2 = this->valid;
  }
  return (bool)uVar2;
}

Assistant:

bool ObjectFile::setAttribute(CK_ATTRIBUTE_TYPE type, const OSAttribute& attribute)
{
	if (!valid)
	{
		DEBUG_MSG("Cannot update invalid object %s", path.c_str());

		return false;
	}

	{
		MutexLocker lock(objectMutex);

		if (attributes[type] != NULL)
		{
			delete attributes[type];

			attributes[type] = NULL;
		}

		attributes[type] = new OSAttribute(attribute);
	}

	store();

	return valid;
}